

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  ZSTD_Sequence *pZVar1;
  BYTE **ppBVar2;
  uint uVar3;
  ZSTD_CDict *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  undefined8 uVar6;
  BYTE *pBVar7;
  uint uVar8;
  ulong uVar9;
  seqDef *psVar10;
  ulong uVar11;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  BYTE *pBVar20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  BYTE *litLimit_w;
  uint local_88 [4];
  uint local_78;
  U32 local_74;
  BYTE *local_70;
  ZSTD_sequencePosition *local_68;
  ulong local_60;
  BYTE *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  BYTE *local_38;
  
  uVar17 = seqPos->idx;
  uVar11 = (ulong)uVar17;
  pZVar4 = cctx->cdict;
  if (pZVar4 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict != (void *)0x0) {
      pZVar4 = (ZSTD_CDict *)&cctx->prefixDict;
      goto LAB_01d25700;
    }
    local_50 = 0;
  }
  else {
LAB_01d25700:
    local_50 = (ulong)(uint)pZVar4->dictContentSize;
  }
  pBVar20 = (BYTE *)(blockSize + (long)src);
  pZVar5 = (cctx->blockState).prevCBlock;
  local_88[2] = pZVar5->rep[2];
  uVar6 = *(undefined8 *)pZVar5->rep;
  local_88[0] = (uint)uVar6;
  local_88[1] = (uint)((ulong)uVar6 >> 0x20);
  local_68 = seqPos;
  if (inSeqsSize <= uVar11) goto LAB_01d25ad2;
  local_70 = pBVar20;
  pBVar20 = pBVar20 + -0x20;
  local_78 = local_88[2];
  local_48 = uVar11;
  local_58 = pBVar20;
  uVar17 = local_88[0];
  uVar22 = local_88[1];
  do {
    pZVar1 = inSeqs + uVar11;
    uVar18 = inSeqs[uVar11].matchLength;
    uVar21 = (ulong)uVar18;
    if ((uVar21 == 0) && (pZVar1->offset == 0)) break;
    uVar3 = pZVar1->litLength;
    uVar19 = (ulong)uVar3;
    if (externalRepSearch == ZSTD_ps_disable) {
      local_74 = pZVar1->offset + 3;
      uVar8 = uVar17;
    }
    else {
      uVar8 = pZVar1->offset;
      if ((uVar19 == 0) || (local_74 = 1, uVar17 != uVar8)) {
        if (uVar22 == uVar8) {
          iVar23 = 2;
LAB_01d257c7:
          local_74 = iVar23 - (uint)(uVar19 == 0);
          goto LAB_01d257cb;
        }
        if (local_78 == uVar8) {
          iVar23 = 3;
          goto LAB_01d257c7;
        }
        if (((uVar19 == 0) && (local_74 = 3, uVar17 - 1 == uVar8)) ||
           (local_74 = uVar8 + 3, local_74 < 4)) goto LAB_01d257cb;
      }
      else {
LAB_01d257cb:
        uVar13 = local_74 - (uVar19 != 0);
        uVar8 = uVar17;
        if (uVar13 == 0) goto LAB_01d2580b;
        if (uVar13 == 3) {
          uVar8 = uVar17 - 1;
        }
        else {
          uVar8 = local_88[uVar13];
        }
        if (uVar13 == 1) {
          uVar22 = local_78;
        }
      }
      local_88[2] = uVar22;
      local_88[1] = uVar17;
      local_88[0] = uVar8;
      local_78 = uVar22;
      uVar22 = uVar17;
    }
LAB_01d2580b:
    uVar17 = uVar8;
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar9 = (ulong)(uVar3 + uVar18) + seqPos->posInSrc;
      seqPos->posInSrc = uVar9;
      uVar15 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar14 = local_50 + uVar9;
      if (uVar15 < uVar9) {
        uVar14 = uVar15;
      }
      if (uVar14 + 3 < (ulong)local_74) {
        return 0xffffffffffffff95;
      }
      if (uVar18 < 4 - ((cctx->appliedParams).cParams.minMatch == 3 ||
                       (cctx->appliedParams).extSeqProdFunc != (ZSTD_sequenceProducer_F)0x0)) {
        return 0xffffffffffffff95;
      }
    }
    if ((cctx->seqStore).maxNbSeq <= (ulong)((int)uVar11 - seqPos->idx)) {
      return 0xffffffffffffff95;
    }
    pBVar7 = (cctx->seqStore).lit;
    if (pBVar20 < (BYTE *)((long)src + uVar19)) {
      local_60 = uVar11;
      local_40 = uVar21;
      local_38 = (BYTE *)src;
      ZSTD_safecopyLiterals(pBVar7,(BYTE *)src,(BYTE *)((long)src + uVar19),pBVar20);
      src = local_38;
      uVar21 = local_40;
LAB_01d258f8:
      ppBVar2 = &(cctx->seqStore).lit;
      *ppBVar2 = *ppBVar2 + uVar19;
      psVar10 = (cctx->seqStore).sequences;
      uVar11 = local_60;
      seqPos = local_68;
      pBVar20 = local_58;
      if (0xffff < uVar3) {
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
    }
    else {
      uVar6 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar7 = *src;
      *(undefined8 *)(pBVar7 + 8) = uVar6;
      if (0x10 < uVar3) {
        pBVar7 = (cctx->seqStore).lit;
        uVar6 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar7 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar7 + 0x18) = uVar6;
        if (0x10 < uVar19 - 0x10) {
          local_60 = uVar11;
          lVar16 = 0;
          do {
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x20) + 8);
            pBVar20 = pBVar7 + lVar16 + 0x20;
            *(undefined8 *)pBVar20 = *(undefined8 *)((long)src + lVar16 + 0x20);
            *(undefined8 *)(pBVar20 + 8) = uVar6;
            uVar6 = *(undefined8 *)((BYTE *)((long)src + lVar16 + 0x30) + 8);
            *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)((long)src + lVar16 + 0x30);
            *(undefined8 *)(pBVar20 + 0x18) = uVar6;
            lVar16 = lVar16 + 0x20;
          } while (pBVar20 + 0x20 < pBVar7 + uVar19);
          goto LAB_01d258f8;
        }
      }
      ppBVar2 = &(cctx->seqStore).lit;
      *ppBVar2 = *ppBVar2 + uVar19;
      psVar10 = (cctx->seqStore).sequences;
    }
    psVar10->litLength = (U16)uVar3;
    psVar10->offBase = local_74;
    if (0xffff < uVar21 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar10 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    psVar10->mlBase = (U16)(uVar21 - 3);
    (cctx->seqStore).sequences = psVar10 + 1;
    src = (void *)((long)src + (ulong)(uVar3 + (int)uVar21));
    uVar11 = (ulong)((int)uVar11 + 1);
  } while (uVar11 < inSeqsSize);
  uVar22 = local_88[1];
  uVar17 = (uint)uVar11;
  pBVar20 = local_70;
  if (uVar17 == (uint)local_48 || externalRepSearch != ZSTD_ps_disable) goto LAB_01d25ad2;
  uVar18 = (uint)local_48 + 2;
  if (uVar17 - 1 < uVar18) {
    if (uVar17 == uVar18) goto LAB_01d25aa2;
    local_88[1] = local_88[0];
    local_88[2] = uVar22;
  }
  else {
    local_88[0] = inSeqs[uVar17 - 3].offset;
LAB_01d25aa2:
    local_88[1] = inSeqs[uVar17 - 2].offset;
    local_88[2] = local_88[0];
  }
  local_88[0] = inSeqs[uVar17 - 1].offset;
LAB_01d25ad2:
  pZVar5 = (cctx->blockState).nextCBlock;
  pZVar5->rep[2] = local_88[2];
  *(ulong *)pZVar5->rep = CONCAT44(local_88[1],local_88[0]);
  uVar21 = (ulong)inSeqs[uVar11].litLength;
  if (uVar21 != 0) {
    switchD_015de399::default((cctx->seqStore).lit,src,uVar21);
    ppBVar2 = &(cctx->seqStore).lit;
    *ppBVar2 = *ppBVar2 + uVar21;
    src = (void *)((long)src + (ulong)inSeqs[uVar11].litLength);
    local_68->posInSrc = local_68->posInSrc + (ulong)inSeqs[uVar11].litLength;
    seqPos = local_68;
  }
  sVar12 = 0xffffffffffffff95;
  if ((BYTE *)src == pBVar20) {
    seqPos->idx = uVar17 + 1;
    sVar12 = 0;
  }
  return sVar12;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx,
                                              ZSTD_sequencePosition* seqPos,
                                        const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                        const void* src, size_t blockSize,
                                        ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 const startIdx = idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;

    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreExplicitBlockDelim (blockSize = %zu)", blockSize);

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; idx < inSeqsSize && (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0); ++idx) {
        U32 const litLength = inSeqs[idx].litLength;
        U32 const matchLength = inSeqs[idx].matchLength;
        U32 offBase;

        if (externalRepSearch == ZSTD_ps_disable) {
            offBase = OFFSET_TO_OFFBASE(inSeqs[idx].offset);
        } else {
            U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize, ZSTD_hasExtSeqProd(&cctx->appliedParams)),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
    }

    /* If we skipped repcode search while parsing, we need to update repcodes now */
    assert(externalRepSearch != ZSTD_ps_auto);
    assert(idx >= startIdx);
    if (externalRepSearch == ZSTD_ps_disable && idx != startIdx) {
        U32* const rep = updatedRepcodes.rep;
        U32 lastSeqIdx = idx - 1; /* index of last non-block-delimiter sequence */

        if (lastSeqIdx >= startIdx + 2) {
            rep[2] = inSeqs[lastSeqIdx - 2].offset;
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else if (lastSeqIdx == startIdx + 1) {
            rep[2] = rep[0];
            rep[1] = inSeqs[lastSeqIdx - 1].offset;
            rep[0] = inSeqs[lastSeqIdx].offset;
        } else {
            assert(lastSeqIdx == startIdx);
            rep[2] = rep[1];
            rep[1] = rep[0];
            rep[0] = inSeqs[lastSeqIdx].offset;
        }
    }

    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, externalSequences_invalid, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}